

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::queryIndexedState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  GLboolean v;
  bool bVar1;
  int i_2;
  ostream *poVar2;
  long lVar3;
  Hex<2UL> *value_00;
  int i_1;
  char *pcVar4;
  StateQueryMemoryWriteGuard<unsigned_char[4]> value_3;
  StateQueryMemoryWriteGuard<unsigned_char> value;
  StateQueryMemoryWriteGuard<unsigned_char[4]> local_1dc;
  ulong local_1d0;
  string local_1c8;
  StateQueryMemoryWriteGuard<long[4]> local_1a8 [3];
  
  switch(type) {
  case QUERY_INDEXED_BOOLEAN:
    local_1a8[0].m_preguard[0]._0_4_ = CONCAT13(local_1a8[0].m_preguard[0]._3_1_,0xdedede);
    glu::CallLogWrapper::glGetBooleani_v
              (gl,target,index,(GLboolean *)((long)local_1a8[0].m_preguard + 1));
    bVar1 = checkError(result,gl,"glGetBooleani_v");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char> *)local_1a8,result);
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,local_1a8[0].m_preguard[0]._1_1_);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_BOOLEAN;
    goto LAB_008328b1;
  case QUERY_INDEXED_BOOLEAN_VEC4:
    StateQueryMemoryWriteGuard<unsigned_char[4]>::StateQueryMemoryWriteGuard(&local_1dc);
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,local_1dc.m_value);
    bVar1 = checkError(result,gl,"glGetBooleani_v");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity(&local_1dc,result);
    if (!bVar1) {
      return;
    }
    bVar1 = true;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      bVar1 = (bool)(bVar1 & local_1dc.m_value[lVar3] < 2);
    }
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Boolean vec4 value was not neither GL_TRUE nor GL_FALSE, got (");
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        pcVar4 = ", ";
        if (lVar3 == 0) {
          pcVar4 = "";
        }
        poVar2 = std::operator<<((ostream *)local_1a8,pcVar4);
        local_1d0 = (ulong)local_1dc.m_value[lVar3];
        de::toString<tcu::Format::Hex<2ul>>(&local_1c8,(de *)&local_1d0,value_00);
        std::operator<<(poVar2,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::operator<<((ostream *)local_1a8,")");
      std::__cxx11::stringbuf::str();
      tcu::ResultCollector::fail(result,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      return;
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      *(bool *)((long)local_1a8[0].m_preguard + lVar3) = local_1dc.m_value[lVar3] == '\x01';
    }
    state->m_type = DATATYPE_BOOLEAN_VEC4;
    local_1a8[0].m_preguard[0]._4_4_ = (GLint)local_1a8[0].m_preguard[0];
    goto LAB_00832af3;
  case QUERY_INDEXED_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabledi(gl,target,index);
    bVar1 = checkError(result,gl,"glIsEnabledi");
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,v);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_BOOLEAN;
    local_1a8[0].m_preguard[0]._1_1_ = v;
LAB_008328b1:
    (state->m_v).vBool = local_1a8[0].m_preguard[0]._1_1_ == '\x01';
    break;
  case QUERY_INDEXED_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_1a8);
    glu::CallLogWrapper::glGetIntegeri_v
              (gl,target,index,(GLint *)((long)local_1a8[0].m_preguard + 4));
    bVar1 = checkError(result,gl,"glGetIntegeri_v");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)local_1a8,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_INTEGER;
LAB_00832af3:
    (state->m_v).vInt = local_1a8[0].m_preguard[0]._4_4_;
    break;
  case QUERY_INDEXED_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)local_1a8);
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,(GLint *)(local_1a8[0].m_preguard + 2));
    bVar1 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_1a8,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER_VEC4;
      (state->m_v).vInt64 = local_1a8[0].m_preguard[2];
      (state->m_v).vInt64Vec4[1] = local_1a8[0].m_preguard[3];
    }
    break;
  case QUERY_INDEXED_INTEGER64:
    StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long> *)local_1a8);
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,local_1a8[0].m_preguard + 1);
    bVar1 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_1a8,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER64;
      (state->m_v).vInt64 = local_1a8[0].m_preguard[1];
    }
    break;
  case QUERY_INDEXED_INTEGER64_VEC4:
    StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard(local_1a8);
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,local_1a8[0].m_value);
    bVar1 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long[4]>::verifyValidity(local_1a8,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER64_VEC4;
      (state->m_v).vInt64 = local_1a8[0].m_value[0];
      (state->m_v).vInt64Vec4[1] = local_1a8[0].m_value[1];
      (state->m_v).vInt64Vec4[2] = local_1a8[0].m_value[2];
      (state->m_v).vInt64Vec4[3] = local_1a8[0].m_value[3];
    }
  }
  return;
}

Assistant:

void queryIndexedState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_INDEXED_BOOLEAN_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean[4]> value;
			gl.glGetBooleani_v(target, index, value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			if (!verifyBooleanVec4Validity(result, value))
				return;

			{
				bool res[4];

				for (int i = 0; i < 4; i++)
					res[i] = value[i] == GL_TRUE;

				state = QueriedState(res);
			}

			break;
		}

		case QUERY_INDEXED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetIntegeri_v(target, index, value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint64[4]> value;
			gl.glGetInteger64i_v(target, index, value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabledi(target, index);

			if (!checkError(result, gl, "glIsEnabledi"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleani_v(target, index, &value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegeri_v(target, index, &value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64i_v(target, index, &value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}